

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O1

int evthread_set_condition_callbacks(evthread_condition_callbacks *cbs)

{
  _func_void_ptr_uint *p_Var1;
  _func_int_void_ptr_int *p_Var2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  evthread_condition_callbacks *peVar6;
  evthread_condition_callbacks *peVar7;
  evthread_condition_callbacks *peVar8;
  
  iVar5 = evthread_lock_debugging_enabled_;
  peVar6 = &original_cond_fns_;
  peVar7 = &original_cond_fns_;
  if (evthread_lock_debugging_enabled_ == 0) {
    peVar7 = &evthread_cond_fns_;
  }
  if ((event_debug_mode_on_ != 0) && (event_debug_created_threadable_ctx_ != 0)) {
    event_errx(1,"evthread initialization must be called BEFORE anything else!");
  }
  peVar8 = &original_cond_fns_;
  if (evthread_lock_debugging_enabled_ == 0) {
    peVar8 = &evthread_cond_fns_;
  }
  p_Var1 = peVar8->alloc_condition;
  if (cbs == (evthread_condition_callbacks *)0x0) {
    if (p_Var1 != (_func_void_ptr_uint *)0x0) {
      event_warnx(
                 "Trying to disable condition functions after they have been set up will probaby not work."
                 );
    }
    peVar7->free_condition = (_func_void_void_ptr *)0x0;
    peVar7->signal_condition = (_func_int_void_ptr_int *)0x0;
    *(undefined8 *)peVar7 = 0;
    peVar7->alloc_condition = (_func_void_ptr_uint *)0x0;
    peVar7->wait_condition = (_func_int_void_ptr_void_ptr_timeval_ptr *)0x0;
LAB_002353d4:
    iVar5 = 0;
  }
  else {
    if (p_Var1 == (_func_void_ptr_uint *)0x0) {
      if ((((cbs->alloc_condition != (_func_void_ptr_uint *)0x0) &&
           (cbs->free_condition != (_func_void_void_ptr *)0x0)) &&
          (cbs->signal_condition != (_func_int_void_ptr_int *)0x0)) &&
         (cbs->wait_condition != (_func_int_void_ptr_void_ptr_timeval_ptr *)0x0)) {
        peVar7->wait_condition = cbs->wait_condition;
        iVar3 = cbs->condition_api_version;
        uVar4 = *(undefined4 *)&cbs->field_0x4;
        p_Var1 = cbs->alloc_condition;
        p_Var2 = cbs->signal_condition;
        peVar7->free_condition = cbs->free_condition;
        peVar7->signal_condition = p_Var2;
        peVar7->condition_api_version = iVar3;
        *(undefined4 *)&peVar7->field_0x4 = uVar4;
        peVar7->alloc_condition = p_Var1;
      }
      if (iVar5 == 0) {
        return 0;
      }
      evthread_cond_fns_.alloc_condition = cbs->alloc_condition;
      evthread_cond_fns_.free_condition = cbs->free_condition;
      evthread_cond_fns_.signal_condition = cbs->signal_condition;
      return 0;
    }
    if ((peVar7->condition_api_version == cbs->condition_api_version) &&
       (p_Var1 == cbs->alloc_condition)) {
      peVar7 = &original_cond_fns_;
      if (evthread_lock_debugging_enabled_ == 0) {
        peVar7 = &evthread_cond_fns_;
      }
      if (peVar7->free_condition == cbs->free_condition) {
        peVar7 = &original_cond_fns_;
        if (evthread_lock_debugging_enabled_ == 0) {
          peVar7 = &evthread_cond_fns_;
        }
        if (peVar7->signal_condition == cbs->signal_condition) {
          if (evthread_lock_debugging_enabled_ == 0) {
            peVar6 = &evthread_cond_fns_;
          }
          if (peVar6->wait_condition == cbs->wait_condition) goto LAB_002353d4;
        }
      }
    }
    event_warnx("Can\'t change condition callbacks once they have been initialized.");
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

int
evthread_set_condition_callbacks(const struct evthread_condition_callbacks *cbs)
{
	struct evthread_condition_callbacks *target = evthread_get_condition_callbacks();

#ifndef EVENT__DISABLE_DEBUG_MODE
	if (event_debug_mode_on_) {
		if (event_debug_created_threadable_ctx_) {
		    event_errx(1, "evthread initialization must be called BEFORE anything else!");
		}
	}
#endif

	if (!cbs) {
		if (target->alloc_condition)
			event_warnx("Trying to disable condition functions "
			    "after they have been set up will probaby not "
			    "work.");
		memset(target, 0, sizeof(evthread_cond_fns_));
		return 0;
	}
	if (target->alloc_condition) {
		/* Uh oh; we already had condition callbacks set up.*/
		if (target->condition_api_version == cbs->condition_api_version &&
			target->alloc_condition == cbs->alloc_condition &&
			target->free_condition == cbs->free_condition &&
			target->signal_condition == cbs->signal_condition &&
			target->wait_condition == cbs->wait_condition) {
			/* no change -- allow this. */
			return 0;
		}
		event_warnx("Can't change condition callbacks once they "
		    "have been initialized.");
		return -1;
	}
	if (cbs->alloc_condition && cbs->free_condition &&
	    cbs->signal_condition && cbs->wait_condition) {
		memcpy(target, cbs, sizeof(evthread_cond_fns_));
	}
	if (evthread_lock_debugging_enabled_) {
		evthread_cond_fns_.alloc_condition = cbs->alloc_condition;
		evthread_cond_fns_.free_condition = cbs->free_condition;
		evthread_cond_fns_.signal_condition = cbs->signal_condition;
	}
	return 0;
}